

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcLib.c
# Opt level: O3

void Abc_DesPrint(Abc_Des_t *p)

{
  void *pvVar1;
  long lVar2;
  Vec_Ptr_t *pVVar3;
  long lVar4;
  ulong uVar5;
  long lVar6;
  
  printf("Models of design %s:\n",p->pName);
  pVVar3 = p->vModules;
  if (0 < pVVar3->nSize) {
    uVar5 = 0;
    do {
      pvVar1 = pVVar3->pArray[uVar5];
      uVar5 = uVar5 + 1;
      printf("%2d : %20s   ",uVar5 & 0xffffffff,*(undefined8 *)((long)pvVar1 + 8));
      printf("nd = %6d   lat = %6d   whitebox = %3d   blackbox = %3d\n",
             (ulong)*(uint *)((long)pvVar1 + 0x7c),(ulong)*(uint *)((long)pvVar1 + 0x80),
             (ulong)*(uint *)((long)pvVar1 + 0x84),(ulong)*(uint *)((long)pvVar1 + 0x88));
      if ((*(int *)((long)pvVar1 + 0x88) != 0) &&
         (lVar4 = *(long *)((long)pvVar1 + 0x50), 0 < *(int *)(lVar4 + 4))) {
        lVar6 = 0;
        do {
          lVar2 = *(long *)(*(long *)(lVar4 + 8) + lVar6 * 8);
          if ((*(uint *)(lVar2 + 0x14) & 0xf) == 9) {
            printf("     %20s (whitebox)\n",*(undefined8 *)(*(long *)(lVar2 + 0x38) + 8));
            lVar4 = *(long *)((long)pvVar1 + 0x50);
          }
          lVar6 = lVar6 + 1;
        } while (lVar6 < *(int *)(lVar4 + 4));
        if (0 < *(int *)(lVar4 + 4)) {
          lVar6 = 0;
          do {
            lVar2 = *(long *)(*(long *)(lVar4 + 8) + lVar6 * 8);
            if ((*(uint *)(lVar2 + 0x14) & 0xf) == 10) {
              printf("     %20s (blackbox)\n",*(undefined8 *)(*(long *)(lVar2 + 0x38) + 8));
              lVar4 = *(long *)((long)pvVar1 + 0x50);
            }
            lVar6 = lVar6 + 1;
          } while (lVar6 < *(int *)(lVar4 + 4));
        }
      }
      pVVar3 = p->vModules;
    } while ((long)uVar5 < (long)pVVar3->nSize);
  }
  return;
}

Assistant:

void Abc_DesPrint( Abc_Des_t * p )
{
    Abc_Ntk_t * pNtk;
    Abc_Obj_t * pObj;
    int i, k;
    printf( "Models of design %s:\n", p->pName );
    Vec_PtrForEachEntry( Abc_Ntk_t *, p->vModules, pNtk, i )
    {
        printf( "%2d : %20s   ", i+1, pNtk->pName );
        printf( "nd = %6d   lat = %6d   whitebox = %3d   blackbox = %3d\n", 
            Abc_NtkNodeNum(pNtk), Abc_NtkLatchNum(pNtk), 
            Abc_NtkWhiteboxNum(pNtk), Abc_NtkBlackboxNum(pNtk) );
        if ( Abc_NtkBlackboxNum(pNtk) == 0 )
            continue;
        Abc_NtkForEachWhitebox( pNtk, pObj, k )
            printf( "     %20s (whitebox)\n", Abc_NtkName((Abc_Ntk_t *)pObj->pData) );
        Abc_NtkForEachBlackbox( pNtk, pObj, k )
            printf( "     %20s (blackbox)\n", Abc_NtkName((Abc_Ntk_t *)pObj->pData) );
    }
}